

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

ssize_t __thiscall
Assimp::CFIReaderImpl::read(CFIReaderImpl *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  undefined7 extraout_var;
  reference pvVar4;
  CFIReaderImpl *extraout_RAX;
  element_type *peVar5;
  undefined4 extraout_var_01;
  CFIReaderImpl *extraout_RAX_00;
  undefined4 extraout_var_02;
  CFIReaderImpl *extraout_RAX_01;
  CFIReaderImpl *pCVar6;
  DeadlyImportError *pDVar7;
  EXML_NODE EVar8;
  undefined1 local_60 [8];
  shared_ptr<const_Assimp::FIValue> comment;
  undefined1 local_30 [8];
  shared_ptr<const_Assimp::FIValue> chars;
  uint8_t b;
  CFIReaderImpl *this_local;
  undefined7 extraout_var_00;
  
  if ((this->headerPending & 1U) != 0) {
    this->headerPending = false;
    parseHeader(this);
  }
  pCVar6 = this;
  if ((this->terminatorPending & 1U) == 0) {
    if ((CFIReaderImpl *)this->dataP < (CFIReaderImpl *)this->dataEnd) {
      chars.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _7_1_ = *this->dataP;
      if (chars.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi._7_1_ < 0x80) {
        parseElement(this);
        this_local._7_1_ = 1;
        pCVar6 = extraout_RAX;
      }
      else if (chars.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._7_1_ < 0xc0) {
        parseNonIdentifyingStringOrIndex3
                  ((CFIReaderImpl *)local_30,
                   (vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
                    *)this);
        peVar5 = std::
                 __shared_ptr_access<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_30);
        iVar3 = (**peVar5->_vptr_FIValue)();
        std::__cxx11::string::operator=
                  ((string *)&this->nodeName,(string *)CONCAT44(extraout_var_01,iVar3));
        this->currentNodeType = EXN_TEXT;
        this_local._7_1_ = 1;
        std::shared_ptr<const_Assimp::FIValue>::~shared_ptr
                  ((shared_ptr<const_Assimp::FIValue> *)local_30);
        pCVar6 = extraout_RAX_00;
      }
      else if (chars.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._7_1_ < 0xe0) {
        if ((chars.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi._7_1_ & 0xfc) == 0xc4) {
          this->dataP = this->dataP + 1;
          if ((chars.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._7_1_ & 2) != 0) {
            parseIdentifyingStringOrIndex(this,&(this->vocabulary).otherURITable);
          }
          if ((chars.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._7_1_ & 1) != 0) {
            parseIdentifyingStringOrIndex(this,&(this->vocabulary).otherURITable);
          }
          std::
          stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push(&this->elementStack,(value_type *)EmptyString_abi_cxx11_);
          this->currentNodeType = EXN_UNKNOWN;
          this_local._7_1_ = 1;
        }
        else {
          if ((chars.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._7_1_ & 0xfc) != 200) {
LAB_00a3259b:
            pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            DeadlyImportError::DeadlyImportError(pDVar7,(string *)parseErrorMessage_abi_cxx11_);
            __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          this->dataP = this->dataP + 1;
          parseIdentifyingStringOrIndex(this,&(this->vocabulary).otherNCNameTable);
          if ((chars.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._7_1_ & 2) != 0) {
            parseIdentifyingStringOrIndex(this,&(this->vocabulary).otherURITable);
          }
          if ((chars.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._7_1_ & 1) != 0) {
            parseIdentifyingStringOrIndex(this,&(this->vocabulary).otherURITable);
          }
          this->currentNodeType = EXN_UNKNOWN;
          this_local._7_1_ = 1;
        }
      }
      else if (chars.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._7_1_ < 0xf0) {
        if (chars.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi._7_1_ == 0xe1) {
          this->dataP = this->dataP + 1;
          parseIdentifyingStringOrIndex(this,&(this->vocabulary).otherNCNameTable);
          if ((long)this->dataEnd - (long)this->dataP < 1) {
            pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            DeadlyImportError::DeadlyImportError(pDVar7,(string *)parseErrorMessage_abi_cxx11_);
            __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          parseNonIdentifyingStringOrIndex1
                    ((CFIReaderImpl *)
                     &comment.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
                      *)this);
          std::shared_ptr<const_Assimp::FIValue>::~shared_ptr
                    ((shared_ptr<const_Assimp::FIValue> *)
                     &comment.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          this->currentNodeType = EXN_UNKNOWN;
          this_local._7_1_ = 1;
        }
        else {
          if (chars.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._7_1_ != 0xe2) goto LAB_00a3259b;
          this->dataP = this->dataP + 1;
          if ((long)this->dataEnd - (long)this->dataP < 1) {
            pDVar7 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            DeadlyImportError::DeadlyImportError(pDVar7,(string *)parseErrorMessage_abi_cxx11_);
            __cxa_throw(pDVar7,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          parseNonIdentifyingStringOrIndex1
                    ((CFIReaderImpl *)local_60,
                     (vector<std::shared_ptr<const_Assimp::FIValue>,_std::allocator<std::shared_ptr<const_Assimp::FIValue>_>_>
                      *)this);
          peVar5 = std::
                   __shared_ptr_access<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_60);
          iVar3 = (**peVar5->_vptr_FIValue)();
          std::__cxx11::string::operator=
                    ((string *)&this->nodeName,(string *)CONCAT44(extraout_var_02,iVar3));
          this->currentNodeType = EXN_COMMENT;
          this_local._7_1_ = 1;
          std::shared_ptr<const_Assimp::FIValue>::~shared_ptr
                    ((shared_ptr<const_Assimp::FIValue> *)local_60);
          pCVar6 = extraout_RAX_01;
        }
      }
      else {
        this->dataP = this->dataP + 1;
        if (chars.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi._7_1_ == 0xff) {
          this->terminatorPending = true;
        }
        bVar1 = std::
                stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::empty(&this->elementStack);
        pCVar6 = (CFIReaderImpl *)CONCAT71(extraout_var_00,bVar1);
        if (bVar1) {
          this_local._7_1_ = 0;
        }
        else {
          pvVar4 = std::
                   stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::top(&this->elementStack);
          std::__cxx11::string::operator=((string *)&this->nodeName,(string *)pvVar4);
          std::
          stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::pop(&this->elementStack);
          bVar2 = std::__cxx11::string::empty();
          EVar8 = EXN_ELEMENT_END;
          if ((bVar2 & 1) != 0) {
            EVar8 = EXN_UNKNOWN;
          }
          this->currentNodeType = EVar8;
          this_local._7_1_ = 1;
          pCVar6 = this;
        }
      }
    }
    else {
      this_local._7_1_ = 0;
      pCVar6 = (CFIReaderImpl *)this->dataP;
    }
  }
  else {
    this->terminatorPending = false;
    bVar1 = std::
            stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::empty(&this->elementStack);
    if (bVar1) {
      this_local._7_1_ = 0;
      pCVar6 = (CFIReaderImpl *)CONCAT71(extraout_var,bVar1);
    }
    else {
      pvVar4 = std::
               stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::top(&this->elementStack);
      std::__cxx11::string::operator=((string *)&this->nodeName,(string *)pvVar4);
      std::
      stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pop(&this->elementStack);
      bVar2 = std::__cxx11::string::empty();
      EVar8 = EXN_ELEMENT_END;
      if ((bVar2 & 1) != 0) {
        EVar8 = EXN_UNKNOWN;
      }
      this->currentNodeType = EVar8;
      this_local._7_1_ = 1;
    }
  }
  return CONCAT71((int7)((ulong)pCVar6 >> 8),this_local._7_1_);
}

Assistant:

virtual bool read() /*override*/ {
        if (headerPending) {
            headerPending = false;
            parseHeader();
        }
        if (terminatorPending) {
            terminatorPending = false;
            if (elementStack.empty()) {
                return false;
            }
            else {
                nodeName = elementStack.top();
                elementStack.pop();
                currentNodeType = nodeName.empty() ? irr::io::EXN_UNKNOWN : irr::io::EXN_ELEMENT_END;
                return true;
            }
        }
        if (dataP >= dataEnd) {
            return false;
        }
        uint8_t b = *dataP;
        if (b < 0x80) { // Element (C.2.11.2, C.3.7.2)
            // C.3
            parseElement();
            return true;
        }
        else if (b < 0xc0) { // Characters (C.3.7.5)
            // C.7
            auto chars = parseNonIdentifyingStringOrIndex3(vocabulary.charactersTable);
            nodeName = chars->toString();
            currentNodeType = irr::io::EXN_TEXT;
            return true;
        }
        else if (b < 0xe0) {
            if ((b & 0xfc) == 0xc4) { // DTD (C.2.11.5)
                // C.9
                ++dataP;
                if (b & 0x02) {
                    /*const std::string &systemID =*/ parseIdentifyingStringOrIndex(vocabulary.otherURITable);
                }
                if (b & 0x01) {
                    /*const std::string &publicID =*/ parseIdentifyingStringOrIndex(vocabulary.otherURITable);
                }
                elementStack.push(EmptyString);
                currentNodeType = irr::io::EXN_UNKNOWN;
                return true;
            }
            else if ((b & 0xfc) == 0xc8) { // Unexpanded entity reference (C.3.7.4)
                // C.6
                ++dataP;
                /*const std::string &name =*/ parseIdentifyingStringOrIndex(vocabulary.otherNCNameTable);
                if (b & 0x02) {
                    /*const std::string &systemID =*/ parseIdentifyingStringOrIndex(vocabulary.otherURITable);
                }
                if (b & 0x01) {
                    /*const std::string &publicID =*/ parseIdentifyingStringOrIndex(vocabulary.otherURITable);
                }
                currentNodeType = irr::io::EXN_UNKNOWN;
                return true;
            }
        }
        else if (b < 0xf0) {
            if (b == 0xe1) { // Processing instruction (C.2.11.3, C.3.7.3)
                // C.5
                ++dataP;
                /*const std::string &target =*/ parseIdentifyingStringOrIndex(vocabulary.otherNCNameTable);
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                /*std::shared_ptr<const FIValue> data =*/ parseNonIdentifyingStringOrIndex1(vocabulary.otherStringTable);
                currentNodeType = irr::io::EXN_UNKNOWN;
                return true;
            }
            else if (b == 0xe2) { // Comment (C.2.11.4, C.3.7.6)
                // C.8
                ++dataP;
                if (dataEnd - dataP < 1) {
                    throw DeadlyImportError(parseErrorMessage);
                }
                std::shared_ptr<const FIValue> comment = parseNonIdentifyingStringOrIndex1(vocabulary.otherStringTable);
                nodeName = comment->toString();
                currentNodeType = irr::io::EXN_COMMENT;
                return true;
            }
        }
        else { // Terminator (C.2.12, C.3.8)
            ++dataP;
            if (b == 0xff) {
                terminatorPending = true;
            }
            if (elementStack.empty()) {
                return false;
            }
            else {
                nodeName = elementStack.top();
                elementStack.pop();
                currentNodeType = nodeName.empty() ? irr::io::EXN_UNKNOWN : irr::io::EXN_ELEMENT_END;
                return true;
            }
        }
        throw DeadlyImportError(parseErrorMessage);
    }